

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Snapshot.cpp
# Opt level: O1

RealType __thiscall OpenMD::Snapshot::getPotentialEnergy(Snapshot *this)

{
  int i;
  long lVar1;
  RealType RVar2;
  double dVar3;
  double dVar4;
  
  if (this->hasPotentialEnergy == false) {
    RVar2 = getLongRangePotential(this);
    (this->frameData).potentialEnergy = RVar2;
    RVar2 = getShortRangePotential(this);
    dVar3 = RVar2 + (this->frameData).potentialEnergy;
    (this->frameData).potentialEnergy = dVar3;
    if (this->hasSelfPotential == false) {
      (this->frameData).selfPotential = 0.0;
      dVar4 = 0.0;
      lVar1 = 0;
      do {
        dVar4 = dVar4 + (this->frameData).selfPotentials.data_[lVar1];
        lVar1 = lVar1 + 1;
      } while (lVar1 != 7);
      (this->frameData).selfPotential = dVar4;
      this->hasSelfPotential = true;
      this->hasPotentialEnergy = false;
      this->hasTotalEnergy = false;
    }
    dVar3 = dVar3 + (this->frameData).selfPotential;
    (this->frameData).potentialEnergy = dVar3;
    if (this->hasExcludedPotential == false) {
      (this->frameData).excludedPotential = 0.0;
      dVar4 = 0.0;
      lVar1 = 0;
      do {
        dVar4 = dVar4 + (this->frameData).excludedPotentials.data_[lVar1];
        lVar1 = lVar1 + 1;
      } while (lVar1 != 7);
      (this->frameData).excludedPotential = dVar4;
      this->hasExcludedPotential = true;
      this->hasPotentialEnergy = false;
      this->hasTotalEnergy = false;
    }
    (this->frameData).potentialEnergy = dVar3 + (this->frameData).excludedPotential;
    this->hasPotentialEnergy = true;
    this->hasTotalEnergy = false;
  }
  return (this->frameData).potentialEnergy;
}

Assistant:

RealType Snapshot::getPotentialEnergy() {
    if (!hasPotentialEnergy) {
      frameData.potentialEnergy = this->getLongRangePotential();
      frameData.potentialEnergy += this->getShortRangePotential();
      frameData.potentialEnergy += this->getSelfPotential();
      frameData.potentialEnergy += this->getExcludedPotential();
      hasPotentialEnergy = true;
      hasTotalEnergy     = false;
    }
    return frameData.potentialEnergy;
  }